

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::resize
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,size_t newSize,
          Constructable *value)

{
  size_type sVar1;
  long lVar2;
  pointer pCVar3;
  int iVar4;
  int iVar5;
  pointer pCVar6;
  ulong uVar7;
  ulong uVar8;
  Constructable *this_00;
  Constructable temp;
  Constructable local_30;
  
  uVar8 = this->len;
  lVar2 = newSize - uVar8;
  if (newSize < uVar8) {
    this_00 = this->data_ + newSize;
    lVar2 = uVar8 * 8 + newSize * -8;
    do {
      anon_unknown.dwarf_d691dd::Constructable::~Constructable(this_00);
      this_00 = this_00 + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  else {
    if (newSize < uVar8 || lVar2 == 0) {
      return;
    }
    uVar7 = this->cap;
    iVar5 = (int)value;
    if (uVar7 < newSize) {
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls + 1;
      (anonymous_namespace)::Constructable::numCopyConstructorCalls =
           (anonymous_namespace)::Constructable::numCopyConstructorCalls + 1;
      local_30.constructed = true;
      local_30.value = iVar5;
      if (newSize >> 0x3c == 0) {
        uVar8 = uVar7 * 2;
        if (uVar7 * 2 <= newSize) {
          uVar8 = newSize;
        }
        if (0xfffffffffffffff - uVar7 < uVar7) {
          uVar8 = 0xfffffffffffffff;
        }
        pCVar6 = (pointer)newSize;
        pCVar3 = (pointer)operator_new(uVar8 * 8);
        sVar1 = this->len;
        if (sVar1 != 0) {
          pCVar6 = this->data_;
          iVar4 = 0;
          lVar2 = 0;
          do {
            (&pCVar3->constructed)[lVar2] = true;
            *(undefined4 *)((long)&pCVar3->value + lVar2) =
                 *(undefined4 *)((long)&pCVar6->value + lVar2);
            *(undefined4 *)((long)&pCVar6->value + lVar2) = 0;
            lVar2 = lVar2 + 8;
            iVar4 = iVar4 + -1;
          } while (sVar1 * 8 - lVar2 != 0);
          (anonymous_namespace)::Constructable::numConstructorCalls =
               (anonymous_namespace)::Constructable::numConstructorCalls - iVar4;
          pCVar6 = (pointer)(ulong)(anonymous_namespace)::Constructable::numConstructorCalls;
          (anonymous_namespace)::Constructable::numMoveConstructorCalls =
               (anonymous_namespace)::Constructable::numMoveConstructorCalls - iVar4;
        }
        lVar2 = newSize - sVar1;
        if (0 < lVar2) {
          pCVar6 = pCVar3 + sVar1;
          uVar7 = lVar2 + 1;
          do {
            pCVar6->constructed = true;
            pCVar6->value = iVar5;
            pCVar6 = pCVar6 + 1;
            uVar7 = uVar7 - 1;
          } while (1 < uVar7);
          (anonymous_namespace)::Constructable::numConstructorCalls =
               (anonymous_namespace)::Constructable::numConstructorCalls + (int)lVar2;
          (anonymous_namespace)::Constructable::numCopyConstructorCalls =
               (anonymous_namespace)::Constructable::numCopyConstructorCalls + (int)lVar2;
        }
        cleanup(this,(EVP_PKEY_CTX *)pCVar6);
        this->len = newSize;
        this->cap = uVar8;
        this->data_ = pCVar3;
        anon_unknown.dwarf_d691dd::Constructable::~Constructable(&local_30);
        return;
      }
      detail::throwLengthError();
    }
    if (0 < lVar2) {
      pCVar6 = this->data_ + uVar8;
      uVar8 = lVar2 + 1;
      do {
        pCVar6->constructed = true;
        pCVar6->value = iVar5;
        pCVar6 = pCVar6 + 1;
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
      (anonymous_namespace)::Constructable::numConstructorCalls =
           (anonymous_namespace)::Constructable::numConstructorCalls + (int)lVar2;
      (anonymous_namespace)::Constructable::numCopyConstructorCalls =
           (anonymous_namespace)::Constructable::numCopyConstructorCalls + (int)lVar2;
    }
  }
  this->len = newSize;
  return;
}

Assistant:

void resize(size_t newSize, const T& value) { resizeImpl(newSize, value); }